

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::AddInput(TransactionContext *this,UtxoData *utxo,uint32_t sequence)

{
  ulong uVar1;
  CfdException *this_00;
  uint in_EDX;
  long in_RSI;
  Txid *in_RDI;
  Utxo temp;
  UtxoData dest;
  UtxoData *in_stack_00000630;
  Utxo *in_stack_00000638;
  undefined4 in_stack_00000640;
  UtxoData *this_01;
  UtxoData *__args;
  string *in_stack_fffffffffffff9c0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  CfdError in_stack_fffffffffffff9cc;
  UtxoData *in_stack_fffffffffffffa10;
  UtxoData local_540;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [36];
  uint local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  uVar1 = cfd::core::Txid::IsValid();
  if ((uVar1 & 1) == 0) {
    local_4d = 1;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Failed to AddInput. invalid utxo txid.",&local_39);
    core::CfdException::CfdException(this_00,in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c0);
    local_4d = 0;
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  this_01 = &local_540;
  UtxoData::UtxoData(in_stack_fffffffffffffa10);
  __args = (UtxoData *)0x0;
  this_02 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
  UtxoUtil::ConvertToUtxo
            ((UtxoData *)CONCAT44(sequence,in_stack_00000640),in_stack_00000638,in_stack_00000630);
  cfd::core::Transaction::AddTxIn
            (in_RDI,(int)local_10 + 0x28,*(uint *)(local_10 + 0x48),(Script *)(ulong)local_14);
  std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
            (this_02,__args);
  UtxoData::~UtxoData(this_01);
  return;
}

Assistant:

void TransactionContext::AddInput(const UtxoData& utxo, uint32_t sequence) {
  if (!utxo.txid.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to AddInput. invalid utxo txid.");
  }

  UtxoData dest;
  Utxo temp;
  memset(&temp, 0, sizeof(temp));
  UtxoUtil::ConvertToUtxo(utxo, &temp, &dest);

  AddTxIn(utxo.txid, utxo.vout, sequence);
  utxo_map_.emplace_back(dest);
}